

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O1

void __thiscall flatbuffers::python::Version::Version(Version *this,string *version)

{
  istream *piVar1;
  char dot;
  stringstream ss;
  char local_199;
  stringstream local_198 [128];
  ios_base local_118 [264];
  
  this->major = 0;
  this->minor = 0;
  this->micro = 0;
  std::__cxx11::stringstream::stringstream(local_198,(string *)version,_S_out|_S_in);
  piVar1 = (istream *)std::istream::operator>>((istream *)local_198,&this->major);
  piVar1 = std::operator>>(piVar1,&local_199);
  piVar1 = (istream *)std::istream::operator>>(piVar1,&this->minor);
  piVar1 = std::operator>>(piVar1,&local_199);
  std::istream::operator>>(piVar1,&this->micro);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

Version::Version(const std::string &version) {
  std::stringstream ss(version);
  char dot;
  ss >> major >> dot >> minor >> dot >> micro;
}